

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

int QtPrivate::compareStrings(QStringView lhs,QLatin1StringView rhs,CaseSensitivity cs)

{
  char16_t *pcVar1;
  byte bVar2;
  char16_t cVar3;
  int iVar4;
  int iVar5;
  byte *b;
  ulong blen;
  ulong alen;
  char16_t *a;
  ulong uVar6;
  uint uVar7;
  
  alen = lhs.m_size;
  a = lhs.m_data;
  blen = rhs.m_size;
  b = (byte *)rhs.m_data;
  if (cs != CaseSensitive) {
    iVar4 = ucstricmp(alen,a,blen,(char *)b);
    return iVar4;
  }
  uVar6 = blen;
  if (alen < blen) {
    uVar6 = alen;
  }
  pcVar1 = a + uVar6;
  do {
    if (pcVar1 <= a) {
      iVar4 = 0;
      break;
    }
    cVar3 = *a;
    bVar2 = *b;
    a = a + 1;
    b = b + 1;
    uVar7 = (uint)(ushort)cVar3 - (uint)bVar2;
    uVar6 = uVar6 & 0xffffffff;
    if (uVar7 != 0) {
      uVar6 = (ulong)uVar7;
    }
    iVar4 = (int)uVar6;
  } while (uVar7 == 0);
  iVar5 = (((long)blen < (long)alen) - 1) + (uint)((long)blen < (long)alen);
  if (alen == blen) {
    iVar5 = 0;
  }
  if (iVar4 != 0) {
    iVar5 = iVar4;
  }
  return iVar5;
}

Assistant:

int QtPrivate::compareStrings(QStringView lhs, QLatin1StringView rhs, Qt::CaseSensitivity cs) noexcept
{
    if (cs == Qt::CaseSensitive)
        return ucstrcmp(lhs.utf16(), lhs.size(), rhs.latin1(), rhs.size());
    return ucstricmp(lhs.size(), lhs.utf16(), rhs.size(), rhs.latin1());
}